

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

int __thiscall
btLemkeAlgorithm::findLexicographicMinimum(btLemkeAlgorithm *this,btMatrixXf *A,int *pivotColIndex)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  btVectorX<float> *pbVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  btAlignedObjectArray<float> *this_00;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  btAlignedObjectArray<btVectorX<float>_> Rows;
  btVectorXf vec;
  btAlignedObjectArray<btVectorX<float>_> bStack_98;
  uint local_74;
  int local_70;
  int local_6c;
  btMatrixXf *local_68;
  int *local_60;
  ulong local_58;
  btAlignedObjectArray<float> local_50;
  
  uVar1 = A->m_rows;
  bStack_98.m_ownsMemory = true;
  lVar10 = 0;
  bStack_98.m_data = (btVectorX<float> *)0x0;
  bStack_98.m_size = 0;
  bStack_98.m_capacity = 0;
  local_68 = A;
  if (0 < (int)uVar1) {
    local_6c = uVar1 + 1;
    local_70 = uVar1 * 2;
    local_58 = (ulong)(uVar1 * 2 + 1);
    uVar8 = 0;
    local_60 = pivotColIndex;
    do {
      btVectorX<float>::btVectorX((btVectorX<float> *)&local_50,local_6c);
      if ((long)local_50.m_size != 0) {
        memset(local_50.m_data,0,(long)local_50.m_size << 2);
      }
      if (bStack_98.m_size == bStack_98.m_capacity) {
        uVar7 = bStack_98.m_size * 2;
        if (bStack_98.m_size == 0) {
          uVar7 = 1;
        }
        if (bStack_98.m_size < (int)uVar7) {
          local_74 = uVar7;
          if (uVar7 == 0) {
            pbVar6 = (btVectorX<float> *)0x0;
          }
          else {
            pbVar6 = (btVectorX<float> *)btAlignedAllocInternal((long)(int)uVar7 << 5,0x10);
          }
          if (0 < bStack_98.m_size) {
            uVar12 = (ulong)(uint)bStack_98.m_size;
            lVar10 = 0;
            do {
              btAlignedObjectArray<float>::btAlignedObjectArray
                        ((btAlignedObjectArray<float> *)
                         ((long)&(pbVar6->m_storage).field_0x0 + lVar10),
                         (btAlignedObjectArray<float> *)
                         ((long)&((bStack_98.m_data)->m_storage).field_0x0 + lVar10));
              lVar10 = lVar10 + 0x20;
            } while (uVar12 << 5 != lVar10);
            lVar10 = (long)bStack_98.m_size;
            if (0 < lVar10) {
              lVar11 = 0;
              do {
                btAlignedObjectArray<float>::~btAlignedObjectArray
                          ((btAlignedObjectArray<float> *)
                           ((long)&((bStack_98.m_data)->m_storage).field_0x0 + lVar11));
                lVar11 = lVar11 + 0x20;
              } while (lVar10 * 0x20 != lVar11);
            }
          }
          pivotColIndex = local_60;
          A = local_68;
          if ((bStack_98.m_data != (btVectorX<float> *)0x0) && (bStack_98.m_ownsMemory == true)) {
            btAlignedFreeInternal(bStack_98.m_data);
          }
          bStack_98.m_ownsMemory = true;
          bStack_98.m_capacity = local_74;
          bStack_98.m_data = pbVar6;
        }
      }
      btAlignedObjectArray<float>::btAlignedObjectArray
                (&bStack_98.m_data[bStack_98.m_size].m_storage,&local_50);
      bStack_98.m_size = bStack_98.m_size + 1;
      iVar2 = A->m_cols;
      iVar9 = (int)uVar8 * iVar2;
      pfVar3 = (A->m_storage).m_data;
      fVar13 = pfVar3[(long)iVar9 + (long)*pivotColIndex];
      if (0.0 < fVar13) {
        pfVar4 = bStack_98.m_data[uVar8].m_storage.m_data;
        *pfVar4 = pfVar3[(int)local_58 + iVar9] / fVar13;
        pfVar4[1] = pfVar3[iVar9 + local_70] / fVar13;
        if (uVar1 != 1) {
          lVar10 = 0;
          do {
            pfVar4[lVar10 + 2] = pfVar3[iVar2 * (int)uVar8 + 1 + (int)lVar10] / fVar13;
            lVar10 = lVar10 + 1;
          } while ((ulong)uVar1 - 1 != lVar10);
        }
      }
      btAlignedObjectArray<float>::~btAlignedObjectArray(&local_50);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
    if (0 < bStack_98.m_size) {
      lVar10 = 0;
      do {
        fVar13 = btVectorX<float>::nrm2(bStack_98.m_data + lVar10);
        uVar7 = bStack_98.m_size;
        if (0.0 < fVar13) {
          lVar11 = 0;
          if (0 < bStack_98.m_size) {
            do {
              if (lVar10 != lVar11) {
                fVar13 = btVectorX<float>::nrm2(bStack_98.m_data + lVar11);
                uVar7 = bStack_98.m_size;
                if (0.0 < fVar13) {
                  this_00 = &local_50;
                  btVectorX<float>::btVectorX((btVectorX<float> *)&local_50,uVar1 + 1);
                  pfVar3 = bStack_98.m_data[lVar11].m_storage.m_data;
                  pfVar4 = bStack_98.m_data[lVar10].m_storage.m_data;
                  uVar8 = 0;
                  do {
                    local_50.m_data[uVar8] = pfVar3[uVar8] - pfVar4[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar1 + 1 != uVar8);
                  bVar5 = LexicographicPositive((btLemkeAlgorithm *)this_00,(btVectorXf *)&local_50)
                  ;
                  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_50);
                  uVar7 = bStack_98.m_size;
                  if (!bVar5) break;
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)uVar7);
          }
          if ((uint)lVar11 == uVar7) goto LAB_001d1b1d;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)uVar7);
    }
    lVar10 = 0;
  }
LAB_001d1b1d:
  btAlignedObjectArray<btVectorX<float>_>::~btAlignedObjectArray(&bStack_98);
  return (int)lVar10;
}

Assistant:

int btLemkeAlgorithm::findLexicographicMinimum(const btMatrixXu& A, const int & pivotColIndex) {
	  int RowIndex = 0;
	  int dim = A.rows();
	  btAlignedObjectArray<btVectorXu> Rows;
	  for (int row = 0; row < dim; row++) 
	  {

		  btVectorXu vec(dim + 1);
		  vec.setZero();//, INIT, 0.)
		  Rows.push_back(vec);
		  btScalar a = A(row, pivotColIndex);
		  if (a > 0) {
			  Rows[row][0] = A(row, 2 * dim + 1) / a;
			  Rows[row][1] = A(row, 2 * dim) / a;
			  for (int j = 2; j < dim + 1; j++)
				  Rows[row][j] = A(row, j - 1) / a;

#ifdef BT_DEBUG_OSTREAM
		//		if (DEBUGLEVEL) {
			//	  cout << "Rows(" << row << ") = " << Rows[row] << endl;
				// }
#endif 
		  }
	  }

	  for (int i = 0; i < Rows.size(); i++) 
	  {
		  if (Rows[i].nrm2() > 0.) {

			  int j = 0;
			  for (; j < Rows.size(); j++) 
			  {
				  if(i != j)
				  {
					  if(Rows[j].nrm2() > 0.)
					  {
						  btVectorXu test(dim + 1);
						  for (int ii=0;ii<dim+1;ii++)
						  {
							  test[ii] = Rows[j][ii] - Rows[i][ii];
						  }

						  //=Rows[j] - Rows[i]
						  if (! LexicographicPositive(test))
							  break;
					  }
				  }
			  }

			  if (j == Rows.size()) 
			  {
				  RowIndex += i;
				  break;
			  }
		  }
	  }

	  return RowIndex;
  }